

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O0

LIBSSH2_PUBLICKEY * publickey_init(LIBSSH2_SESSION *session)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  LIBSSH2_CHANNEL *pLVar4;
  LIBSSH2_PUBLICKEY *pLVar5;
  unsigned_long lang_len;
  unsigned_long descr_len;
  unsigned_long status;
  uchar *s_1;
  ssize_t nwritten;
  uchar *s;
  int rc;
  int response;
  LIBSSH2_SESSION *session_local;
  
  if (session->pkeyInit_state == libssh2_NB_state_idle) {
    session->pkeyInit_data = (uchar *)0x0;
    session->pkeyInit_pkey = (LIBSSH2_PUBLICKEY *)0x0;
    session->pkeyInit_channel = (LIBSSH2_CHANNEL *)0x0;
    session->pkeyInit_state = libssh2_NB_state_allocated;
  }
  _rc = session;
  if (session->pkeyInit_state == libssh2_NB_state_allocated) {
    pLVar4 = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
    _rc->pkeyInit_channel = pLVar4;
    if (_rc->pkeyInit_channel == (LIBSSH2_CHANNEL *)0x0) {
      iVar1 = libssh2_session_last_errno(_rc);
      if (iVar1 == -0x25) {
        return (LIBSSH2_PUBLICKEY *)0x0;
      }
      _libssh2_error(_rc,-0x15,"Unable to startup channel");
      goto LAB_0012e2ea;
    }
    _rc->pkeyInit_state = libssh2_NB_state_sent;
  }
  if (_rc->pkeyInit_state == libssh2_NB_state_sent) {
    s._0_4_ = _libssh2_channel_process_startup(_rc->pkeyInit_channel,"subsystem",9,"publickey",9);
    if ((int)s == -0x25) {
      _libssh2_error(_rc,-0x25,"Would block starting publickey subsystem");
      return (LIBSSH2_PUBLICKEY *)0x0;
    }
    if ((int)s != 0) {
      _libssh2_error(_rc,-0x15,"Unable to request publickey subsystem");
      goto LAB_0012e2ea;
    }
    _rc->pkeyInit_state = libssh2_NB_state_sent1;
  }
  if (_rc->pkeyInit_state == libssh2_NB_state_sent1) {
    s._0_4_ = _libssh2_channel_extended_data(_rc->pkeyInit_channel,1);
    if ((int)s == -0x25) {
      _libssh2_error(_rc,-0x25,"Would block starting publickey subsystem");
      return (LIBSSH2_PUBLICKEY *)0x0;
    }
    pLVar5 = (LIBSSH2_PUBLICKEY *)_libssh2_calloc(_rc,0x80);
    _rc->pkeyInit_pkey = pLVar5;
    if (_rc->pkeyInit_pkey == (LIBSSH2_PUBLICKEY *)0x0) {
      _libssh2_error(_rc,-6,"Unable to allocate a new publickey structure");
      goto LAB_0012e2ea;
    }
    _rc->pkeyInit_pkey->channel = _rc->pkeyInit_channel;
    _rc->pkeyInit_pkey->version = 0;
    nwritten = (ssize_t)_rc->pkeyInit_buffer;
    _libssh2_htonu32((uchar *)nwritten,0xf);
    nwritten = nwritten + 4;
    _libssh2_htonu32((uchar *)nwritten,7);
    *(undefined4 *)(nwritten + 4) = 0x73726576;
    *(undefined2 *)(nwritten + 8) = 0x6f69;
    *(undefined1 *)(nwritten + 10) = 0x6e;
    nwritten = nwritten + 0xb;
    _libssh2_htonu32((uchar *)nwritten,2);
    _rc->pkeyInit_buffer_sent = 0;
    _rc->pkeyInit_state = libssh2_NB_state_sent2;
  }
  if (_rc->pkeyInit_state == libssh2_NB_state_sent2) {
    s_1 = (uchar *)_libssh2_channel_write
                             (_rc->pkeyInit_channel,0,_rc->pkeyInit_buffer,
                              0x13 - _rc->pkeyInit_buffer_sent);
    if (s_1 == (uchar *)0xffffffffffffffdb) {
      _libssh2_error(_rc,-0x25,"Would block sending publickey version packet");
      return (LIBSSH2_PUBLICKEY *)0x0;
    }
    if ((long)s_1 < 0) {
      _libssh2_error(_rc,(int)s_1,"Unable to send publickey version packet");
      goto LAB_0012e2ea;
    }
    _rc->pkeyInit_buffer_sent = (size_t)(s_1 + _rc->pkeyInit_buffer_sent);
    if (_rc->pkeyInit_buffer_sent < 0x13) {
      _libssh2_error(_rc,-0x25,"Need to be called again to complete this");
      return (LIBSSH2_PUBLICKEY *)0x0;
    }
    _rc->pkeyInit_state = libssh2_NB_state_sent3;
  }
  if (_rc->pkeyInit_state == libssh2_NB_state_sent3) {
    while( true ) {
      s._0_4_ = publickey_packet_receive
                          (_rc->pkeyInit_pkey,&_rc->pkeyInit_data,&_rc->pkeyInit_data_len);
      if ((int)s == -0x25) {
        _libssh2_error(_rc,-0x25,"Would block waiting for response from publickey subsystem");
        return (LIBSSH2_PUBLICKEY *)0x0;
      }
      if ((int)s != 0) {
        _libssh2_error(_rc,-0x1e,"Timeout waiting for response from publickey subsystem");
        goto LAB_0012e2ea;
      }
      status = (unsigned_long)_rc->pkeyInit_data;
      s._4_4_ = publickey_response_id((uchar **)&status,_rc->pkeyInit_data_len);
      if (s._4_4_ < 0) {
        _libssh2_error(_rc,-0x24,"Invalid publickey subsystem response code");
        goto LAB_0012e2ea;
      }
      if (_rc->pkeyInit_data_len < 4) {
        _libssh2_error(_rc,-0x26,"Public key init data too small");
        goto LAB_0012e2ea;
      }
      if (s._4_4_ == 0) break;
      if (s._4_4_ == 1) {
        uVar3 = _libssh2_ntohu32((uchar *)status);
        _rc->pkeyInit_pkey->version = uVar3;
        if (2 < _rc->pkeyInit_pkey->version) {
          _rc->pkeyInit_pkey->version = 2;
        }
        (*_rc->free)(_rc->pkeyInit_data,&_rc->abstract);
        _rc->pkeyInit_data = (uchar *)0x0;
        _rc->pkeyInit_state = libssh2_NB_state_idle;
        return _rc->pkeyInit_pkey;
      }
      _libssh2_error(_rc,-0x24,"Unexpected publickey subsystem response, ignoring");
      (*_rc->free)(_rc->pkeyInit_data,&_rc->abstract);
      _rc->pkeyInit_data = (uchar *)0x0;
    }
    if (_rc->pkeyInit_data_len < 8) {
      _libssh2_error(_rc,-0x26,"Public key init data too small");
    }
    else {
      uVar3 = _libssh2_ntohu32((uchar *)status);
      status = status + 4;
      uVar2 = _libssh2_ntohu32((uchar *)status);
      status = status + 4;
      if (_rc->pkeyInit_data + _rc->pkeyInit_data_len < (uchar *)(status + uVar2 + 4)) {
        _libssh2_error(_rc,-0x26,"Public key init data too small");
      }
      else {
        status = uVar2 + status;
        uVar2 = _libssh2_ntohu32((uchar *)status);
        status = status + 4;
        if (_rc->pkeyInit_data + _rc->pkeyInit_data_len < (uchar *)(status + uVar2)) {
          _libssh2_error(_rc,-0x26,"Public key init data too small");
        }
        else {
          status = uVar2 + status;
          if (_rc->pkeyInit_data + _rc->pkeyInit_data_len < status) {
            _libssh2_error(_rc,-0x24,"Malformed publickey subsystem packet");
          }
          else {
            publickey_status_error((LIBSSH2_PUBLICKEY *)0x0,_rc,(ulong)uVar3);
          }
        }
      }
    }
  }
LAB_0012e2ea:
  _rc->pkeyInit_state = libssh2_NB_state_sent4;
  if ((_rc->pkeyInit_channel == (LIBSSH2_CHANNEL *)0x0) ||
     (s._0_4_ = _libssh2_channel_close(_rc->pkeyInit_channel), (int)s != -0x25)) {
    if (_rc->pkeyInit_pkey != (LIBSSH2_PUBLICKEY *)0x0) {
      (*_rc->free)(_rc->pkeyInit_pkey,&_rc->abstract);
      _rc->pkeyInit_pkey = (LIBSSH2_PUBLICKEY *)0x0;
    }
    if (_rc->pkeyInit_data != (uchar *)0x0) {
      (*_rc->free)(_rc->pkeyInit_data,&_rc->abstract);
      _rc->pkeyInit_data = (uchar *)0x0;
    }
    _rc->pkeyInit_state = libssh2_NB_state_idle;
  }
  else {
    _libssh2_error(_rc,-0x25,"Would block closing channel");
  }
  return (LIBSSH2_PUBLICKEY *)0x0;
}

Assistant:

static LIBSSH2_PUBLICKEY *publickey_init(LIBSSH2_SESSION *session)
{
    int response;
    int rc;

    if(session->pkeyInit_state == libssh2_NB_state_idle) {
        session->pkeyInit_data = NULL;
        session->pkeyInit_pkey = NULL;
        session->pkeyInit_channel = NULL;

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Initializing publickey subsystem"));

        session->pkeyInit_state = libssh2_NB_state_allocated;
    }

    if(session->pkeyInit_state == libssh2_NB_state_allocated) {

        session->pkeyInit_channel =
            _libssh2_channel_open(session, "session",
                                  sizeof("session") - 1,
                                  LIBSSH2_CHANNEL_WINDOW_DEFAULT,
                                  LIBSSH2_CHANNEL_PACKET_DEFAULT, NULL,
                                  0);
        if(!session->pkeyInit_channel) {
            if(libssh2_session_last_errno(session) == LIBSSH2_ERROR_EAGAIN)
                /* The error state is already set, so leave it */
                return NULL;
            _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_FAILURE,
                           "Unable to startup channel");
            goto err_exit;
        }

        session->pkeyInit_state = libssh2_NB_state_sent;
    }

    if(session->pkeyInit_state == libssh2_NB_state_sent) {
        rc = _libssh2_channel_process_startup(session->pkeyInit_channel,
                                              "subsystem",
                                              sizeof("subsystem") - 1,
                                              "publickey",
                                              sizeof("publickey") - 1);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block starting publickey subsystem");
            return NULL;
        }
        else if(rc) {
            _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_FAILURE,
                           "Unable to request publickey subsystem");
            goto err_exit;
        }

        session->pkeyInit_state = libssh2_NB_state_sent1;
    }

    if(session->pkeyInit_state == libssh2_NB_state_sent1) {
        unsigned char *s;
        rc = _libssh2_channel_extended_data(session->pkeyInit_channel,
                                         LIBSSH2_CHANNEL_EXTENDED_DATA_IGNORE);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block starting publickey subsystem");
            return NULL;
        }

        session->pkeyInit_pkey =
            LIBSSH2_CALLOC(session, sizeof(LIBSSH2_PUBLICKEY));
        if(!session->pkeyInit_pkey) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate a new publickey structure");
            goto err_exit;
        }
        session->pkeyInit_pkey->channel = session->pkeyInit_channel;
        session->pkeyInit_pkey->version = 0;

        s = session->pkeyInit_buffer;
        _libssh2_htonu32(s, 4 + (sizeof("version") - 1) + 4);
        s += 4;
        _libssh2_htonu32(s, sizeof("version") - 1);
        s += 4;
        memcpy(s, "version", sizeof("version") - 1);
        s += sizeof("version") - 1;
        _libssh2_htonu32(s, LIBSSH2_PUBLICKEY_VERSION);

        session->pkeyInit_buffer_sent = 0;

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Sending publickey advertising version %d support",
                       (int) LIBSSH2_PUBLICKEY_VERSION));

        session->pkeyInit_state = libssh2_NB_state_sent2;
    }

    if(session->pkeyInit_state == libssh2_NB_state_sent2) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(session->pkeyInit_channel, 0,
                                          session->pkeyInit_buffer,
                                          19 - session->pkeyInit_buffer_sent);
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block sending publickey version packet");
            return NULL;
        }
        else if(nwritten < 0) {
            _libssh2_error(session, (int)nwritten,
                           "Unable to send publickey version packet");
            goto err_exit;
        }
        session->pkeyInit_buffer_sent += nwritten;
        if(session->pkeyInit_buffer_sent < 19) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Need to be called again to complete this");
            return NULL;
        }

        session->pkeyInit_state = libssh2_NB_state_sent3;
    }

    if(session->pkeyInit_state == libssh2_NB_state_sent3) {
        for(;;) {
            unsigned char *s;
            rc = publickey_packet_receive(session->pkeyInit_pkey,
                                          &session->pkeyInit_data,
                                          &session->pkeyInit_data_len);
            if(rc == LIBSSH2_ERROR_EAGAIN) {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block waiting for response from "
                               "publickey subsystem");
                return NULL;
            }
            else if(rc) {
                _libssh2_error(session, LIBSSH2_ERROR_SOCKET_TIMEOUT,
                               "Timeout waiting for response from "
                               "publickey subsystem");
                goto err_exit;
            }

            s = session->pkeyInit_data;
            if((response =
                 publickey_response_id(&s, session->pkeyInit_data_len)) < 0) {
                _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                               "Invalid publickey subsystem response code");
                goto err_exit;
            }

            if(session->pkeyInit_data_len < 4) {
                _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                               "Public key init data too small");
                goto err_exit;
            }

            switch(response) {
            case LIBSSH2_PUBLICKEY_RESPONSE_STATUS:
                /* Error */
            {
                unsigned long status, descr_len, lang_len;

                if(session->pkeyInit_data_len >= 8) {
                    status = _libssh2_ntohu32(s);
                    s += 4;
                    descr_len = _libssh2_ntohu32(s);
                    s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "Public key init data too small");
                    goto err_exit;
                }

                if(s + descr_len + 4 <=
                   session->pkeyInit_data + session->pkeyInit_data_len) {
                    /* description starts here */
                    s += descr_len;
                    lang_len = _libssh2_ntohu32(s);
                    s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "Public key init data too small");
                    goto err_exit;
                }

                if(s + lang_len <=
                   session->pkeyInit_data + session->pkeyInit_data_len) {
                    /* lang starts here */
                    s += lang_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "Public key init data too small");
                    goto err_exit;
                }

                if(s >
                    session->pkeyInit_data + session->pkeyInit_data_len) {
                    _libssh2_error(session,
                                   LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                                   "Malformed publickey subsystem packet");
                    goto err_exit;
                }

                publickey_status_error(NULL, session, status);

                goto err_exit;
            }

            case LIBSSH2_PUBLICKEY_RESPONSE_VERSION:
                /* What we want */
                session->pkeyInit_pkey->version = _libssh2_ntohu32(s);
                if(session->pkeyInit_pkey->version >
                    LIBSSH2_PUBLICKEY_VERSION) {
                    _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                                   "Truncate remote publickey version "
                                   "from %u",
                                   session->pkeyInit_pkey->version));
                    session->pkeyInit_pkey->version =
                        LIBSSH2_PUBLICKEY_VERSION;
                }
                _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                               "Enabling publickey subsystem version %u",
                               session->pkeyInit_pkey->version));
                LIBSSH2_FREE(session, session->pkeyInit_data);
                session->pkeyInit_data = NULL;
                session->pkeyInit_state = libssh2_NB_state_idle;
                return session->pkeyInit_pkey;

            default:
                /* Unknown/Unexpected */
                _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                               "Unexpected publickey subsystem response, "
                               "ignoring");
                LIBSSH2_FREE(session, session->pkeyInit_data);
                session->pkeyInit_data = NULL;
            }
        }
    }

    /* Never reached except by direct goto */
err_exit:
    session->pkeyInit_state = libssh2_NB_state_sent4;
    if(session->pkeyInit_channel) {
        rc = _libssh2_channel_close(session->pkeyInit_channel);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block closing channel");
            return NULL;
        }
    }
    if(session->pkeyInit_pkey) {
        LIBSSH2_FREE(session, session->pkeyInit_pkey);
        session->pkeyInit_pkey = NULL;
    }
    if(session->pkeyInit_data) {
        LIBSSH2_FREE(session, session->pkeyInit_data);
        session->pkeyInit_data = NULL;
    }
    session->pkeyInit_state = libssh2_NB_state_idle;
    return NULL;
}